

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  Geometry *pGVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  AABBNodeMB4D *node1;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  float fVar42;
  float fVar48;
  float fVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar77;
  float fVar78;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar79;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  float fVar105;
  float fVar107;
  uint uVar108;
  float fVar109;
  uint uVar110;
  float fVar111;
  uint uVar112;
  undefined1 auVar106 [64];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  int local_a5c;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [8];
  float fStack_a30;
  float fStack_a2c;
  undefined1 local_a28 [16];
  long local_a10;
  undefined1 local_a08 [8];
  float fStack_a00;
  float fStack_9fc;
  Scene *local_9f8;
  ulong local_9f0;
  long local_9e8;
  ulong local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  float local_9c8;
  undefined4 local_9c4;
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  RTCFilterFunctionNArguments local_9a8;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [8];
  float fStack_8e0;
  float fStack_8dc;
  undefined1 local_8d8 [8];
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [8];
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar42 = ray->tfar;
    auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar42) {
      local_aa0 = local_7d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar53._8_4_ = 0x7fffffff;
      auVar53._0_8_ = 0x7fffffff7fffffff;
      auVar53._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx((undefined1  [16])aVar5,auVar53);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar92,1);
      auVar53 = vblendvps_avx((undefined1  [16])aVar5,auVar92,auVar53);
      auVar92 = vrcpps_avx(auVar53);
      fVar48 = auVar92._0_4_;
      auVar65._0_4_ = fVar48 * auVar53._0_4_;
      fVar49 = auVar92._4_4_;
      auVar65._4_4_ = fVar49 * auVar53._4_4_;
      fVar50 = auVar92._8_4_;
      auVar65._8_4_ = fVar50 * auVar53._8_4_;
      fVar90 = auVar92._12_4_;
      auVar65._12_4_ = fVar90 * auVar53._12_4_;
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar53 = vsubps_avx(auVar93,auVar65);
      auVar66._0_4_ = fVar48 + fVar48 * auVar53._0_4_;
      auVar66._4_4_ = fVar49 + fVar49 * auVar53._4_4_;
      auVar66._8_4_ = fVar50 + fVar50 * auVar53._8_4_;
      auVar66._12_4_ = fVar90 + fVar90 * auVar53._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_8f8._4_4_ = uVar4;
      local_8f8._0_4_ = uVar4;
      local_8f8._8_4_ = uVar4;
      local_8f8._12_4_ = uVar4;
      auVar101 = ZEXT1664(local_8f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_908._4_4_ = uVar4;
      local_908._0_4_ = uVar4;
      local_908._8_4_ = uVar4;
      local_908._12_4_ = uVar4;
      auVar102 = ZEXT1664(local_908);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_918._4_4_ = uVar4;
      local_918._0_4_ = uVar4;
      local_918._8_4_ = uVar4;
      local_918._12_4_ = uVar4;
      auVar104 = ZEXT1664(local_918);
      local_928 = vshufps_avx(auVar66,auVar66,0);
      auVar106 = ZEXT1664(local_928);
      auVar53 = vmovshdup_avx(auVar66);
      local_938 = vshufps_avx(auVar66,auVar66,0x55);
      auVar114 = ZEXT1664(local_938);
      auVar92 = vshufpd_avx(auVar66,auVar66,1);
      local_948 = vshufps_avx(auVar66,auVar66,0xaa);
      auVar119 = ZEXT1664(local_948);
      uVar29 = (ulong)(auVar66._0_4_ < 0.0) << 4;
      uVar41 = (ulong)(auVar53._0_4_ < 0.0) << 4 | 0x20;
      uVar30 = (ulong)(auVar92._0_4_ < 0.0) << 4 | 0x40;
      uVar40 = uVar29 ^ 0x10;
      local_958 = vshufps_avx(auVar43,auVar43,0);
      auVar121 = ZEXT1664(local_958);
      local_968 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
      auVar122 = ZEXT1664(local_968);
      local_978 = mm_lookupmask_ps._240_8_;
      uStack_970 = mm_lookupmask_ps._248_8_;
      local_9f0 = uVar29;
LAB_00b6cfcb:
      if (local_aa0 != local_7d8) {
        uVar39 = local_aa0[-1];
        local_aa0 = local_aa0 + -1;
        do {
          fVar42 = (ray->dir).field_0.m128[3];
          auVar43._4_4_ = fVar42;
          auVar43._0_4_ = fVar42;
          auVar43._8_4_ = fVar42;
          auVar43._12_4_ = fVar42;
          do {
            if ((uVar39 & 8) != 0) {
              local_9e8 = (ulong)((uint)uVar39 & 0xf) - 8;
              uVar39 = uVar39 & 0xfffffffffffffff0;
              local_a10 = 0;
              goto LAB_00b6d185;
            }
            uVar25 = uVar39 & 0xfffffffffffffff0;
            pfVar3 = (float *)(uVar25 + 0x80 + uVar29);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar29);
            auVar51._0_4_ = fVar42 * *pfVar3 + *pfVar1;
            auVar51._4_4_ = fVar42 * pfVar3[1] + pfVar1[1];
            auVar51._8_4_ = fVar42 * pfVar3[2] + pfVar1[2];
            auVar51._12_4_ = fVar42 * pfVar3[3] + pfVar1[3];
            auVar53 = vsubps_avx(auVar51,auVar101._0_16_);
            auVar52._0_4_ = auVar106._0_4_ * auVar53._0_4_;
            auVar52._4_4_ = auVar106._4_4_ * auVar53._4_4_;
            auVar52._8_4_ = auVar106._8_4_ * auVar53._8_4_;
            auVar52._12_4_ = auVar106._12_4_ * auVar53._12_4_;
            pfVar3 = (float *)(uVar25 + 0x80 + uVar41);
            auVar53 = vmaxps_avx(auVar121._0_16_,auVar52);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar41);
            auVar67._0_4_ = fVar42 * *pfVar3 + *pfVar1;
            auVar67._4_4_ = fVar42 * pfVar3[1] + pfVar1[1];
            auVar67._8_4_ = fVar42 * pfVar3[2] + pfVar1[2];
            auVar67._12_4_ = fVar42 * pfVar3[3] + pfVar1[3];
            auVar92 = vsubps_avx(auVar67,auVar102._0_16_);
            pfVar3 = (float *)(uVar25 + 0x80 + uVar30);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar30);
            auVar81._0_4_ = fVar42 * *pfVar3 + *pfVar1;
            auVar81._4_4_ = fVar42 * pfVar3[1] + pfVar1[1];
            auVar81._8_4_ = fVar42 * pfVar3[2] + pfVar1[2];
            auVar81._12_4_ = fVar42 * pfVar3[3] + pfVar1[3];
            auVar68._0_4_ = auVar114._0_4_ * auVar92._0_4_;
            auVar68._4_4_ = auVar114._4_4_ * auVar92._4_4_;
            auVar68._8_4_ = auVar114._8_4_ * auVar92._8_4_;
            auVar68._12_4_ = auVar114._12_4_ * auVar92._12_4_;
            auVar92 = vsubps_avx(auVar81,auVar104._0_16_);
            auVar82._0_4_ = auVar119._0_4_ * auVar92._0_4_;
            auVar82._4_4_ = auVar119._4_4_ * auVar92._4_4_;
            auVar82._8_4_ = auVar119._8_4_ * auVar92._8_4_;
            auVar82._12_4_ = auVar119._12_4_ * auVar92._12_4_;
            auVar92 = vmaxps_avx(auVar68,auVar82);
            pfVar3 = (float *)(uVar25 + 0x80 + uVar40);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar40);
            auVar83._0_4_ = fVar42 * *pfVar3 + *pfVar1;
            auVar83._4_4_ = fVar42 * pfVar3[1] + pfVar1[1];
            auVar83._8_4_ = fVar42 * pfVar3[2] + pfVar1[2];
            auVar83._12_4_ = fVar42 * pfVar3[3] + pfVar1[3];
            auVar53 = vmaxps_avx(auVar53,auVar92);
            auVar92 = vsubps_avx(auVar83,auVar101._0_16_);
            auVar69._0_4_ = auVar106._0_4_ * auVar92._0_4_;
            auVar69._4_4_ = auVar106._4_4_ * auVar92._4_4_;
            auVar69._8_4_ = auVar106._8_4_ * auVar92._8_4_;
            auVar69._12_4_ = auVar106._12_4_ * auVar92._12_4_;
            auVar92 = vminps_avx(auVar122._0_16_,auVar69);
            pfVar3 = (float *)(uVar25 + 0x80 + (uVar41 ^ 0x10));
            pfVar1 = (float *)(uVar25 + 0x20 + (uVar41 ^ 0x10));
            auVar84._0_4_ = fVar42 * *pfVar3 + *pfVar1;
            auVar84._4_4_ = fVar42 * pfVar3[1] + pfVar1[1];
            auVar84._8_4_ = fVar42 * pfVar3[2] + pfVar1[2];
            auVar84._12_4_ = fVar42 * pfVar3[3] + pfVar1[3];
            auVar65 = vsubps_avx(auVar84,auVar102._0_16_);
            auVar85._0_4_ = auVar114._0_4_ * auVar65._0_4_;
            auVar85._4_4_ = auVar114._4_4_ * auVar65._4_4_;
            auVar85._8_4_ = auVar114._8_4_ * auVar65._8_4_;
            auVar85._12_4_ = auVar114._12_4_ * auVar65._12_4_;
            pfVar3 = (float *)(uVar25 + 0x80 + (uVar30 ^ 0x10));
            pfVar1 = (float *)(uVar25 + 0x20 + (uVar30 ^ 0x10));
            auVar94._0_4_ = fVar42 * *pfVar3 + *pfVar1;
            auVar94._4_4_ = fVar42 * pfVar3[1] + pfVar1[1];
            auVar94._8_4_ = fVar42 * pfVar3[2] + pfVar1[2];
            auVar94._12_4_ = fVar42 * pfVar3[3] + pfVar1[3];
            auVar65 = vsubps_avx(auVar94,auVar104._0_16_);
            auVar95._0_4_ = auVar119._0_4_ * auVar65._0_4_;
            auVar95._4_4_ = auVar119._4_4_ * auVar65._4_4_;
            auVar95._8_4_ = auVar119._8_4_ * auVar65._8_4_;
            auVar95._12_4_ = auVar119._12_4_ * auVar65._12_4_;
            auVar65 = vminps_avx(auVar85,auVar95);
            auVar92 = vminps_avx(auVar92,auVar65);
            auVar53 = vcmpps_avx(auVar53,auVar92,2);
            if (((uint)uVar39 & 7) == 6) {
              auVar92 = vcmpps_avx(*(undefined1 (*) [16])(uVar25 + 0xe0),auVar43,2);
              auVar65 = vcmpps_avx(auVar43,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
              auVar92 = vandps_avx(auVar92,auVar65);
              auVar53 = vandps_avx(auVar92,auVar53);
            }
            auVar53 = vpslld_avx(auVar53,0x1f);
            uVar26 = vmovmskps_avx(auVar53);
            if (uVar26 == 0) goto LAB_00b6cfcb;
            uVar26 = uVar26 & 0xff;
            lVar8 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar39 = *(ulong *)(uVar25 + lVar8 * 8);
            uVar26 = uVar26 - 1 & uVar26;
            uVar27 = (ulong)uVar26;
          } while (uVar26 == 0);
          do {
            *local_aa0 = uVar39;
            local_aa0 = local_aa0 + 1;
            lVar8 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar39 = *(ulong *)(uVar25 + lVar8 * 8);
            uVar27 = uVar27 - 1 & uVar27;
          } while (uVar27 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00b6d185:
  if (local_a10 == local_9e8) goto LAB_00b6cfcb;
  lVar31 = local_a10 * 0x50;
  local_9f8 = context->scene;
  pGVar7 = (context->scene->geometries).items[*(uint *)(uVar39 + 0x30 + lVar31)].ptr;
  fVar42 = (pGVar7->time_range).lower;
  fVar42 = pGVar7->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar42) / ((pGVar7->time_range).upper - fVar42));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),9);
  auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar55 = vmaxss_avx(auVar99._0_16_,auVar53);
  lVar28 = (long)(int)auVar55._0_4_ * 0x38;
  uVar36 = (ulong)*(uint *)(uVar39 + 4 + lVar31);
  lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar28);
  lVar28 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar28);
  auVar53 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar39 + lVar31) * 4);
  uVar34 = (ulong)*(uint *)(uVar39 + 0x10 + lVar31);
  auVar43 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
  uVar25 = (ulong)*(uint *)(uVar39 + 0x20 + lVar31);
  auVar57 = *(undefined1 (*) [16])(lVar8 + uVar25 * 4);
  auVar92 = *(undefined1 (*) [16])(lVar8 + uVar36 * 4);
  uVar27 = (ulong)*(uint *)(uVar39 + 0x14 + lVar31);
  auVar65 = *(undefined1 (*) [16])(lVar8 + uVar27 * 4);
  uVar32 = (ulong)*(uint *)(uVar39 + 0x24 + lVar31);
  auVar58 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
  uVar33 = (ulong)*(uint *)(uVar39 + 8 + lVar31);
  auVar66 = *(undefined1 (*) [16])(lVar8 + uVar33 * 4);
  local_9e0 = (ulong)*(uint *)(uVar39 + 0x18 + lVar31);
  auVar93 = *(undefined1 (*) [16])(lVar8 + local_9e0 * 4);
  uVar37 = (ulong)*(uint *)(uVar39 + 0x28 + lVar31);
  auVar6 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
  uVar35 = (ulong)*(uint *)(uVar39 + 0xc + lVar31);
  auVar44 = *(undefined1 (*) [16])(lVar8 + uVar35 * 4);
  uVar38 = (ulong)*(uint *)(uVar39 + 0x1c + lVar31);
  auVar45 = *(undefined1 (*) [16])(lVar8 + uVar38 * 4);
  uVar29 = (ulong)*(uint *)(uVar39 + 0x2c + lVar31);
  auVar46 = *(undefined1 (*) [16])(lVar8 + uVar29 * 4);
  auVar47 = *(undefined1 (*) [16])(lVar28 + (ulong)*(uint *)(uVar39 + lVar31) * 4);
  auVar54 = *(undefined1 (*) [16])(lVar28 + uVar34 * 4);
  fVar42 = fVar42 - auVar55._0_4_;
  auVar55 = vunpcklps_avx(auVar53,auVar66);
  auVar66 = vunpckhps_avx(auVar53,auVar66);
  auVar56 = vunpcklps_avx(auVar92,auVar44);
  auVar92 = vunpckhps_avx(auVar92,auVar44);
  auVar53 = *(undefined1 (*) [16])(lVar28 + uVar36 * 4);
  _local_8d8 = vunpcklps_avx(auVar66,auVar92);
  auVar67 = _local_8d8;
  auVar44 = vunpcklps_avx(auVar55,auVar56);
  auVar66 = vunpckhps_avx(auVar55,auVar56);
  auVar55 = vunpcklps_avx(auVar43,auVar93);
  auVar92 = vunpckhps_avx(auVar43,auVar93);
  auVar93 = vunpcklps_avx(auVar65,auVar45);
  auVar65 = vunpckhps_avx(auVar65,auVar45);
  auVar43 = *(undefined1 (*) [16])(lVar28 + uVar33 * 4);
  auVar45 = vunpcklps_avx(auVar92,auVar65);
  auVar56 = vunpcklps_avx(auVar55,auVar93);
  _local_8e8 = vunpckhps_avx(auVar55,auVar93);
  auVar52 = _local_8e8;
  auVar55 = vunpcklps_avx(auVar57,auVar6);
  auVar65 = vunpckhps_avx(auVar57,auVar6);
  auVar6 = vunpcklps_avx(auVar58,auVar46);
  auVar93 = vunpckhps_avx(auVar58,auVar46);
  auVar92 = *(undefined1 (*) [16])(lVar28 + uVar35 * 4);
  auVar46 = vunpcklps_avx(auVar65,auVar93);
  _local_8c8 = vunpcklps_avx(auVar55,auVar6);
  auVar68 = _local_8c8;
  _local_a08 = vunpckhps_avx(auVar55,auVar6);
  auVar51 = _local_a08;
  auVar65 = vunpcklps_avx(auVar47,auVar43);
  auVar43 = vunpckhps_avx(auVar47,auVar43);
  auVar93 = vunpcklps_avx(auVar53,auVar92);
  auVar92 = vunpckhps_avx(auVar53,auVar92);
  auVar53 = *(undefined1 (*) [16])(lVar28 + local_9e0 * 4);
  auVar6 = vunpcklps_avx(auVar43,auVar92);
  auVar47 = vunpcklps_avx(auVar65,auVar93);
  auVar92 = vunpckhps_avx(auVar65,auVar93);
  auVar93 = vunpcklps_avx(auVar54,auVar53);
  auVar65 = vunpckhps_avx(auVar54,auVar53);
  auVar53 = *(undefined1 (*) [16])(lVar28 + uVar27 * 4);
  auVar43 = *(undefined1 (*) [16])(lVar28 + uVar38 * 4);
  auVar54 = vunpcklps_avx(auVar53,auVar43);
  auVar53 = vunpckhps_avx(auVar53,auVar43);
  auVar55 = vunpcklps_avx(auVar65,auVar53);
  auVar57 = vunpcklps_avx(auVar93,auVar54);
  auVar65 = vunpckhps_avx(auVar93,auVar54);
  auVar53 = *(undefined1 (*) [16])(lVar28 + uVar25 * 4);
  auVar43 = *(undefined1 (*) [16])(lVar28 + uVar37 * 4);
  auVar54 = vunpcklps_avx(auVar53,auVar43);
  auVar93 = vunpckhps_avx(auVar53,auVar43);
  auVar53 = *(undefined1 (*) [16])(lVar28 + uVar32 * 4);
  auVar43 = *(undefined1 (*) [16])(lVar28 + uVar29 * 4);
  auVar58 = vunpcklps_avx(auVar53,auVar43);
  auVar53 = vunpckhps_avx(auVar53,auVar43);
  auVar59 = vunpcklps_avx(auVar93,auVar53);
  auVar60 = vunpcklps_avx(auVar54,auVar58);
  auVar93 = vunpckhps_avx(auVar54,auVar58);
  auVar53 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
  auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - fVar42)),ZEXT416((uint)(1.0 - fVar42)),0);
  fVar42 = auVar53._0_4_;
  fVar48 = auVar53._4_4_;
  fVar49 = auVar53._8_4_;
  fVar50 = auVar53._12_4_;
  fVar90 = auVar43._0_4_;
  fVar123 = auVar43._4_4_;
  fVar124 = auVar43._8_4_;
  fVar125 = auVar43._12_4_;
  auVar98._0_4_ = fVar90 * auVar44._0_4_ + fVar42 * auVar47._0_4_;
  auVar98._4_4_ = fVar123 * auVar44._4_4_ + fVar48 * auVar47._4_4_;
  auVar98._8_4_ = fVar124 * auVar44._8_4_ + fVar49 * auVar47._8_4_;
  auVar98._12_4_ = fVar125 * auVar44._12_4_ + fVar50 * auVar47._12_4_;
  auVar100._0_4_ = fVar90 * auVar66._0_4_ + fVar42 * auVar92._0_4_;
  auVar100._4_4_ = fVar123 * auVar66._4_4_ + fVar48 * auVar92._4_4_;
  auVar100._8_4_ = fVar124 * auVar66._8_4_ + fVar49 * auVar92._8_4_;
  auVar100._12_4_ = fVar125 * auVar66._12_4_ + fVar50 * auVar92._12_4_;
  auVar96._0_4_ = fVar90 * (float)local_8d8._0_4_ + fVar42 * auVar6._0_4_;
  auVar96._4_4_ = fVar123 * (float)local_8d8._4_4_ + fVar48 * auVar6._4_4_;
  auVar96._8_4_ = fVar124 * fStack_8d0 + fVar49 * auVar6._8_4_;
  auVar96._12_4_ = fVar125 * fStack_8cc + fVar50 * auVar6._12_4_;
  auVar54._0_4_ = fVar90 * auVar56._0_4_ + fVar42 * auVar57._0_4_;
  auVar54._4_4_ = fVar123 * auVar56._4_4_ + fVar48 * auVar57._4_4_;
  auVar54._8_4_ = fVar124 * auVar56._8_4_ + fVar49 * auVar57._8_4_;
  auVar54._12_4_ = fVar125 * auVar56._12_4_ + fVar50 * auVar57._12_4_;
  auVar70._0_4_ = fVar90 * (float)local_8e8._0_4_ + fVar42 * auVar65._0_4_;
  auVar70._4_4_ = fVar123 * (float)local_8e8._4_4_ + fVar48 * auVar65._4_4_;
  auVar70._8_4_ = fVar124 * fStack_8e0 + fVar49 * auVar65._8_4_;
  auVar70._12_4_ = fVar125 * fStack_8dc + fVar50 * auVar65._12_4_;
  puVar2 = (undefined8 *)(uVar39 + 0x30 + lVar31);
  local_8a8 = *puVar2;
  uStack_8a0 = puVar2[1];
  puVar2 = (undefined8 *)(uVar39 + 0x40 + lVar31);
  local_a88 = auVar45._0_4_;
  fStack_a84 = auVar45._4_4_;
  fStack_a80 = auVar45._8_4_;
  fStack_a7c = auVar45._12_4_;
  auVar103._0_4_ = fVar90 * local_a88 + auVar55._0_4_ * fVar42;
  auVar103._4_4_ = fVar123 * fStack_a84 + auVar55._4_4_ * fVar48;
  auVar103._8_4_ = fVar124 * fStack_a80 + auVar55._8_4_ * fVar49;
  auVar103._12_4_ = fVar125 * fStack_a7c + auVar55._12_4_ * fVar50;
  auVar118._0_4_ = fVar90 * (float)local_8c8._0_4_ + auVar60._0_4_ * fVar42;
  auVar118._4_4_ = fVar123 * (float)local_8c8._4_4_ + auVar60._4_4_ * fVar48;
  auVar118._8_4_ = fVar124 * fStack_8c0 + auVar60._8_4_ * fVar49;
  auVar118._12_4_ = fVar125 * fStack_8bc + auVar60._12_4_ * fVar50;
  auVar120._0_4_ = auVar93._0_4_ * fVar42 + fVar90 * (float)local_a08._0_4_;
  auVar120._4_4_ = auVar93._4_4_ * fVar48 + fVar123 * (float)local_a08._4_4_;
  auVar120._8_4_ = auVar93._8_4_ * fVar49 + fVar124 * fStack_a00;
  auVar120._12_4_ = auVar93._12_4_ * fVar50 + fVar125 * fStack_9fc;
  local_a38._0_4_ = auVar46._0_4_;
  local_a38._4_4_ = auVar46._4_4_;
  fStack_a30 = auVar46._8_4_;
  fStack_a2c = auVar46._12_4_;
  auVar44._0_4_ = fVar90 * (float)local_a38._0_4_ + auVar59._0_4_ * fVar42;
  auVar44._4_4_ = fVar123 * (float)local_a38._4_4_ + auVar59._4_4_ * fVar48;
  auVar44._8_4_ = fVar124 * fStack_a30 + auVar59._8_4_ * fVar49;
  auVar44._12_4_ = fVar125 * fStack_a2c + auVar59._12_4_ * fVar50;
  local_8b8 = *puVar2;
  uStack_8b0 = puVar2[1];
  auVar53 = vsubps_avx(auVar98,auVar54);
  auVar43 = vsubps_avx(auVar100,auVar70);
  auVar92 = vsubps_avx(auVar96,auVar103);
  auVar65 = vsubps_avx(auVar118,auVar98);
  auVar66 = vsubps_avx(auVar120,auVar100);
  auVar93 = vsubps_avx(auVar44,auVar96);
  fVar50 = auVar93._0_4_;
  fVar105 = auVar43._0_4_;
  auVar45._0_4_ = fVar105 * fVar50;
  fVar9 = auVar93._4_4_;
  fVar107 = auVar43._4_4_;
  auVar45._4_4_ = fVar107 * fVar9;
  fVar14 = auVar93._8_4_;
  fVar109 = auVar43._8_4_;
  auVar45._8_4_ = fVar109 * fVar14;
  fVar19 = auVar93._12_4_;
  fVar111 = auVar43._12_4_;
  auVar45._12_4_ = fVar111 * fVar19;
  fVar90 = auVar66._0_4_;
  fVar113 = auVar92._0_4_;
  auVar55._0_4_ = fVar113 * fVar90;
  fVar10 = auVar66._4_4_;
  fVar115 = auVar92._4_4_;
  auVar55._4_4_ = fVar115 * fVar10;
  fVar15 = auVar66._8_4_;
  fVar116 = auVar92._8_4_;
  auVar55._8_4_ = fVar116 * fVar15;
  fVar20 = auVar66._12_4_;
  fVar117 = auVar92._12_4_;
  auVar55._12_4_ = fVar117 * fVar20;
  local_a48 = vsubps_avx(auVar55,auVar45);
  fVar123 = auVar65._0_4_;
  auVar56._0_4_ = fVar113 * fVar123;
  fVar11 = auVar65._4_4_;
  auVar56._4_4_ = fVar115 * fVar11;
  fVar16 = auVar65._8_4_;
  auVar56._8_4_ = fVar116 * fVar16;
  fVar21 = auVar65._12_4_;
  auVar56._12_4_ = fVar117 * fVar21;
  fVar124 = auVar53._0_4_;
  auVar71._0_4_ = fVar50 * fVar124;
  fVar12 = auVar53._4_4_;
  auVar71._4_4_ = fVar9 * fVar12;
  fVar17 = auVar53._8_4_;
  auVar71._8_4_ = fVar14 * fVar17;
  fVar22 = auVar53._12_4_;
  auVar71._12_4_ = fVar19 * fVar22;
  auVar92 = vsubps_avx(auVar71,auVar56);
  auVar72._0_4_ = fVar90 * fVar124;
  auVar72._4_4_ = fVar10 * fVar12;
  auVar72._8_4_ = fVar15 * fVar17;
  auVar72._12_4_ = fVar20 * fVar22;
  auVar86._0_4_ = fVar105 * fVar123;
  auVar86._4_4_ = fVar107 * fVar11;
  auVar86._8_4_ = fVar109 * fVar16;
  auVar86._12_4_ = fVar111 * fVar21;
  local_a58 = vsubps_avx(auVar86,auVar72);
  uVar4 = *(undefined4 *)&(ray->org).field_0;
  auVar87._4_4_ = uVar4;
  auVar87._0_4_ = uVar4;
  auVar87._8_4_ = uVar4;
  auVar87._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar46._4_4_ = uVar4;
  auVar46._0_4_ = uVar4;
  auVar46._8_4_ = uVar4;
  auVar46._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar126._4_4_ = uVar4;
  auVar126._0_4_ = uVar4;
  auVar126._8_4_ = uVar4;
  auVar126._12_4_ = uVar4;
  fVar42 = (ray->dir).field_0.m128[1];
  local_a28 = vsubps_avx(auVar98,auVar87);
  fVar48 = (ray->dir).field_0.m128[2];
  auVar53 = vsubps_avx(auVar100,auVar46);
  _local_a38 = vsubps_avx(auVar96,auVar126);
  fVar125 = local_a38._0_4_;
  auVar97._0_4_ = fVar42 * fVar125;
  fVar13 = local_a38._4_4_;
  auVar97._4_4_ = fVar42 * fVar13;
  fVar18 = local_a38._8_4_;
  auVar97._8_4_ = fVar42 * fVar18;
  fVar23 = local_a38._12_4_;
  auVar97._12_4_ = fVar42 * fVar23;
  fVar80 = auVar53._0_4_;
  auVar127._0_4_ = fVar80 * fVar48;
  fVar88 = auVar53._4_4_;
  auVar127._4_4_ = fVar88 * fVar48;
  fVar89 = auVar53._8_4_;
  auVar127._8_4_ = fVar89 * fVar48;
  fVar91 = auVar53._12_4_;
  auVar127._12_4_ = fVar91 * fVar48;
  auVar43 = vsubps_avx(auVar127,auVar97);
  fVar49 = (ray->dir).field_0.m128[0];
  fVar64 = local_a28._0_4_;
  auVar47._0_4_ = fVar64 * fVar48;
  fVar77 = local_a28._4_4_;
  auVar47._4_4_ = fVar77 * fVar48;
  fVar78 = local_a28._8_4_;
  auVar47._8_4_ = fVar78 * fVar48;
  fVar79 = local_a28._12_4_;
  auVar47._12_4_ = fVar79 * fVar48;
  auVar57._0_4_ = fVar125 * fVar49;
  auVar57._4_4_ = fVar13 * fVar49;
  auVar57._8_4_ = fVar18 * fVar49;
  auVar57._12_4_ = fVar23 * fVar49;
  auVar65 = vsubps_avx(auVar57,auVar47);
  auVar58._0_4_ = fVar80 * fVar49;
  auVar58._4_4_ = fVar88 * fVar49;
  auVar58._8_4_ = fVar89 * fVar49;
  auVar58._12_4_ = fVar91 * fVar49;
  auVar73._0_4_ = fVar42 * fVar64;
  auVar73._4_4_ = fVar42 * fVar77;
  auVar73._8_4_ = fVar42 * fVar78;
  auVar73._12_4_ = fVar42 * fVar79;
  auVar66 = vsubps_avx(auVar73,auVar58);
  auVar93 = local_a58;
  auVar74._0_4_ = local_a48._0_4_ * fVar49 + fVar42 * auVar92._0_4_ + local_a58._0_4_ * fVar48;
  auVar74._4_4_ = local_a48._4_4_ * fVar49 + fVar42 * auVar92._4_4_ + local_a58._4_4_ * fVar48;
  auVar74._8_4_ = local_a48._8_4_ * fVar49 + fVar42 * auVar92._8_4_ + local_a58._8_4_ * fVar48;
  auVar74._12_4_ = local_a48._12_4_ * fVar49 + fVar42 * auVar92._12_4_ + local_a58._12_4_ * fVar48;
  auVar59._8_8_ = 0x8000000080000000;
  auVar59._0_8_ = 0x8000000080000000;
  auVar53 = vandps_avx(auVar74,auVar59);
  uVar26 = auVar53._0_4_;
  local_898._0_4_ =
       (float)(uVar26 ^ (uint)(fVar123 * auVar43._0_4_ +
                              fVar90 * auVar65._0_4_ + fVar50 * auVar66._0_4_));
  uVar108 = auVar53._4_4_;
  local_898._4_4_ =
       (float)(uVar108 ^
              (uint)(fVar11 * auVar43._4_4_ + fVar10 * auVar65._4_4_ + fVar9 * auVar66._4_4_));
  uVar110 = auVar53._8_4_;
  local_898._8_4_ =
       (float)(uVar110 ^
              (uint)(fVar16 * auVar43._8_4_ + fVar15 * auVar65._8_4_ + fVar14 * auVar66._8_4_));
  uVar112 = auVar53._12_4_;
  local_898._12_4_ =
       (float)(uVar112 ^
              (uint)(fVar21 * auVar43._12_4_ + fVar20 * auVar65._12_4_ + fVar19 * auVar66._12_4_));
  local_888._0_4_ =
       (float)(uVar26 ^ (uint)(auVar43._0_4_ * fVar124 +
                              fVar105 * auVar65._0_4_ + fVar113 * auVar66._0_4_));
  local_888._4_4_ =
       (float)(uVar108 ^
              (uint)(auVar43._4_4_ * fVar12 + fVar107 * auVar65._4_4_ + fVar115 * auVar66._4_4_));
  local_888._8_4_ =
       (float)(uVar110 ^
              (uint)(auVar43._8_4_ * fVar17 + fVar109 * auVar65._8_4_ + fVar116 * auVar66._8_4_));
  local_888._12_4_ =
       (float)(uVar112 ^
              (uint)(auVar43._12_4_ * fVar22 + fVar111 * auVar65._12_4_ + fVar117 * auVar66._12_4_))
  ;
  auVar65 = ZEXT816(0) << 0x20;
  auVar53 = vcmpps_avx(local_898,auVar65,5);
  auVar43 = vcmpps_avx(local_888,auVar65,5);
  auVar53 = vandps_avx(auVar53,auVar43);
  auVar60._8_4_ = 0x7fffffff;
  auVar60._0_8_ = 0x7fffffff7fffffff;
  auVar60._12_4_ = 0x7fffffff;
  local_868 = vandps_avx(auVar74,auVar60);
  auVar43 = vcmpps_avx(auVar65,auVar74,4);
  auVar53 = vandps_avx(auVar53,auVar43);
  auVar61._0_4_ = local_898._0_4_ + local_888._0_4_;
  auVar61._4_4_ = local_898._4_4_ + local_888._4_4_;
  auVar61._8_4_ = local_898._8_4_ + local_888._8_4_;
  auVar61._12_4_ = local_898._12_4_ + local_888._12_4_;
  auVar43 = vcmpps_avx(auVar61,local_868,2);
  auVar53 = vandps_avx(auVar53,auVar43);
  auVar6._8_8_ = uStack_970;
  auVar6._0_8_ = local_978;
  auVar6 = auVar6 & auVar53;
  if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar6[0xf] < '\0') {
    auVar24._8_8_ = uStack_970;
    auVar24._0_8_ = local_978;
    auVar53 = vandps_avx(auVar53,auVar24);
    local_878._0_4_ =
         (float)(uVar26 ^ (uint)(local_a48._0_4_ * fVar64 +
                                fVar80 * auVar92._0_4_ + fVar125 * local_a58._0_4_));
    local_878._4_4_ =
         (float)(uVar108 ^
                (uint)(local_a48._4_4_ * fVar77 + fVar88 * auVar92._4_4_ + fVar13 * local_a58._4_4_)
                );
    local_878._8_4_ =
         (float)(uVar110 ^
                (uint)(local_a48._8_4_ * fVar78 + fVar89 * auVar92._8_4_ + fVar18 * local_a58._8_4_)
                );
    local_878._12_4_ =
         (float)(uVar112 ^
                (uint)(local_a48._12_4_ * fVar79 +
                      fVar91 * auVar92._12_4_ + fVar23 * local_a58._12_4_));
    fVar42 = (ray->org).field_0.m128[3];
    fVar48 = local_868._0_4_;
    auVar62._0_4_ = fVar48 * fVar42;
    fVar49 = local_868._4_4_;
    auVar62._4_4_ = fVar49 * fVar42;
    fVar50 = local_868._8_4_;
    auVar62._8_4_ = fVar50 * fVar42;
    fVar90 = local_868._12_4_;
    auVar62._12_4_ = fVar90 * fVar42;
    auVar43 = vcmpps_avx(auVar62,local_878,1);
    fVar42 = ray->tfar;
    auVar75._0_4_ = fVar48 * fVar42;
    auVar75._4_4_ = fVar49 * fVar42;
    auVar75._8_4_ = fVar50 * fVar42;
    auVar75._12_4_ = fVar90 * fVar42;
    auVar65 = vcmpps_avx(local_878,auVar75,2);
    auVar43 = vandps_avx(auVar65,auVar43);
    local_848 = vandps_avx(auVar43,auVar53);
    uVar26 = vmovmskps_avx(local_848);
    if (uVar26 != 0) {
      local_808 = local_a48;
      local_a98 = auVar92._0_8_;
      uStack_a90 = auVar92._8_8_;
      local_7f8 = local_a98;
      uStack_7f0 = uStack_a90;
      local_7e8 = local_a58._0_8_;
      uStack_7e0 = local_a58._8_8_;
      auVar53 = vrcpps_avx(local_868);
      fVar42 = auVar53._0_4_;
      auVar63._0_4_ = fVar48 * fVar42;
      fVar48 = auVar53._4_4_;
      auVar63._4_4_ = fVar49 * fVar48;
      fVar49 = auVar53._8_4_;
      auVar63._8_4_ = fVar50 * fVar49;
      fVar50 = auVar53._12_4_;
      auVar63._12_4_ = fVar90 * fVar50;
      auVar76._8_4_ = 0x3f800000;
      auVar76._0_8_ = 0x3f8000003f800000;
      auVar76._12_4_ = 0x3f800000;
      auVar53 = vsubps_avx(auVar76,auVar63);
      fVar42 = fVar42 + fVar42 * auVar53._0_4_;
      fVar48 = fVar48 + fVar48 * auVar53._4_4_;
      fVar49 = fVar49 + fVar49 * auVar53._8_4_;
      fVar50 = fVar50 + fVar50 * auVar53._12_4_;
      local_818[0] = fVar42 * local_878._0_4_;
      local_818[1] = fVar48 * local_878._4_4_;
      local_818[2] = fVar49 * local_878._8_4_;
      local_818[3] = fVar50 * local_878._12_4_;
      local_838._0_4_ = fVar42 * local_898._0_4_;
      local_838._4_4_ = fVar48 * local_898._4_4_;
      local_838._8_4_ = fVar49 * local_898._8_4_;
      local_838._12_4_ = fVar50 * local_898._12_4_;
      local_828._0_4_ = fVar42 * local_888._0_4_;
      local_828._4_4_ = fVar48 * local_888._4_4_;
      local_828._8_4_ = fVar49 * local_888._8_4_;
      local_828._12_4_ = fVar50 * local_888._12_4_;
      uVar29 = (ulong)(uVar26 & 0xff);
      local_a58 = auVar93;
      _local_a08 = auVar51;
      _local_8e8 = auVar52;
      _local_8d8 = auVar67;
      _local_8c8 = auVar68;
      do {
        uVar25 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        local_9c0 = *(uint *)((long)&local_8a8 + uVar25 * 4);
        pGVar7 = (local_9f8->geometries).items[local_9c0].ptr;
        if ((pGVar7->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00b6d9a5:
            ray->tfar = -INFINITY;
            return;
          }
          local_a48._0_8_ = context->args;
          local_9a8.context = context->user;
          local_9d8 = *(undefined4 *)(local_808 + uVar25 * 4);
          local_9d4 = *(undefined4 *)((long)&local_7f8 + uVar25 * 4);
          local_9d0 = *(undefined4 *)((long)&local_7e8 + uVar25 * 4);
          local_9cc = *(undefined4 *)(local_838 + uVar25 * 4);
          local_9c8 = local_818[uVar25 - 4];
          local_9c4 = *(undefined4 *)((long)&local_8b8 + uVar25 * 4);
          local_9bc = (local_9a8.context)->instID[0];
          local_9b8 = (local_9a8.context)->instPrimID[0];
          local_a28._0_4_ = ray->tfar;
          local_a58._0_8_ = uVar25;
          ray->tfar = local_818[uVar25];
          local_a5c = -1;
          local_9a8.valid = &local_a5c;
          local_9a8.geometryUserPtr = pGVar7->userPtr;
          local_9a8.hit = (RTCHitN *)&local_9d8;
          local_9a8.N = 1;
          local_9a8.ray = (RTCRayN *)ray;
          if ((pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar7->occlusionFilterN)(&local_9a8), *local_9a8.valid != 0)) {
            if ((*(code **)(local_a48._0_8_ + 0x10) == (code *)0x0) ||
               ((((*(byte *)local_a48._0_8_ & 2) == 0 && (((pGVar7->field_8).field_0x2 & 0x40) == 0)
                 ) || ((**(code **)(local_a48._0_8_ + 0x10))(&local_9a8), *local_9a8.valid != 0))))
            goto LAB_00b6d9a5;
          }
          ray->tfar = (float)local_a28._0_4_;
          uVar25 = local_a58._0_8_;
        }
        uVar29 = uVar29 ^ 1L << (uVar25 & 0x3f);
      } while (uVar29 != 0);
    }
  }
  local_a10 = local_a10 + 1;
  auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar101 = ZEXT1664(local_8f8);
  auVar102 = ZEXT1664(local_908);
  auVar104 = ZEXT1664(local_918);
  auVar106 = ZEXT1664(local_928);
  auVar114 = ZEXT1664(local_938);
  auVar119 = ZEXT1664(local_948);
  auVar121 = ZEXT1664(local_958);
  auVar122 = ZEXT1664(local_968);
  uVar29 = local_9f0;
  goto LAB_00b6d185;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }